

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# That.hpp
# Opt level: O2

void ut11::Assert::That<bool,ut11::detail::NotOperand<ut11::Operands::TrueOperand>>
               (size_t line,string *file,bool *expected,
               NotOperand<ut11::Operands::TrueOperand> *operand)

{
  string sStack_58;
  string local_38;
  
  if (*expected == true) {
    std::__cxx11::string::string((string *)&local_38,(string *)file);
    detail::NotOperand<ut11::Operands::TrueOperand>::GetErrorMessage<bool>
              (&sStack_58,operand,expected);
    Fail(line,&local_38,&sStack_58);
    std::__cxx11::string::~string((string *)&sStack_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

inline void That(std::size_t line, std::string file, const Expected& expected, const Operand& operand)
		{
			if ( operand(expected) )
				return;
			Fail(line, file, operand.GetErrorMessage(expected));
		}